

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

uchar * __thiscall CNetChunkHeader::Pack(CNetChunkHeader *this,uchar *pData)

{
  byte bVar1;
  long lStack_8;
  
  *pData = (byte)((uint)this->m_Size >> 6) & 0x3f | (byte)(this->m_Flags << 6);
  bVar1 = (byte)this->m_Size;
  pData[1] = bVar1 & 0x3f;
  if ((this->m_Flags & 1) == 0) {
    lStack_8 = 2;
  }
  else {
    pData[1] = bVar1 & 0x3f | (byte)((uint)this->m_Sequence >> 2) & 0xc0;
    pData[2] = (uchar)this->m_Sequence;
    lStack_8 = 3;
  }
  return pData + lStack_8;
}

Assistant:

unsigned char *CNetChunkHeader::Pack(unsigned char *pData)
{
	pData[0] = ((m_Flags&0x03)<<6) | ((m_Size>>6)&0x3F);
	pData[1] = (m_Size&0x3F);
	if(m_Flags&NET_CHUNKFLAG_VITAL)
	{
		pData[1] |= (m_Sequence>>2)&0xC0;
		pData[2] = m_Sequence&0xFF;
		return pData + 3;
	}
	return pData + 2;
}